

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_access_ptr(Integer g_a,Integer *lo,Integer *hi,void *ptr,Integer *ld)

{
  C_Integer *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  logical lVar5;
  size_t sVar6;
  long lVar7;
  C_Integer CVar8;
  global_array_t *pgVar9;
  ushort uVar10;
  global_array_t *pgVar11;
  long lVar12;
  long lVar13;
  Integer *pIVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long *plVar18;
  Integer ow;
  Integer _hi [7];
  Integer _lo [7];
  char err_string [256];
  long local_200;
  long local_1f8;
  long local_1f0;
  Integer *local_1e8;
  Integer local_1e0;
  long *local_1d8;
  long local_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [7];
  long alStack_180 [9];
  int local_138 [3];
  undefined1 uStack_129;
  undefined7 uStack_128;
  
  local_1f0 = g_a * 0x368;
  iVar4 = GA[g_a + 1000].p_handle;
  lVar15 = (long)iVar4;
  local_1e0 = g_a;
  local_1c8 = (long *)ptr;
  lVar5 = pnga_locate(g_a,lo,&local_200);
  if (lVar5 == 0) {
    pnga_error("locate top failed",0);
  }
  if (iVar4 != -1) {
    local_200 = (long)PGRP_LIST[lVar15].inv_map_proc_list[local_200];
  }
  iVar2 = armci_domain_id(0,(int)local_200);
  iVar3 = armci_domain_my_id(0);
  if ((iVar2 != iVar3) && (local_200 != GAme)) {
    pnga_error("cannot access top of the patch",local_200);
  }
  lVar5 = pnga_locate(local_1e0,hi,&local_200);
  if (lVar5 == 0) {
    pnga_error("locate bottom failed",0);
  }
  if (iVar4 != -1) {
    local_200 = (long)PGRP_LIST[lVar15].inv_map_proc_list[local_200];
  }
  lVar17 = local_1e0 + 1000;
  local_1e8 = lo;
  local_1d0 = lVar15;
  iVar4 = armci_domain_id(0,(int)local_200);
  iVar2 = armci_domain_my_id(0);
  if ((iVar4 != iVar2) && (local_200 != GAme)) {
    pnga_error("cannot access bottom of the patch",local_200);
  }
  lVar15 = lVar17 * 0x368;
  uVar10 = GA[lVar17].ndim;
  lVar16 = (long)(short)uVar10;
  pgVar11 = GA;
  pIVar14 = local_1e8;
  local_1f8 = lVar15;
  local_1d8 = ld;
  if (lVar16 < 1) {
    pgVar9 = GA + lVar17;
  }
  else {
    lVar17 = 0;
    do {
      if (hi[lVar17] < pIVar14[lVar17]) {
        local_138._0_8_ = 0x6c20746f6e6e6163;
        stack0xfffffffffffffed0 = 0x7220657461636f;
        uStack_129 = 0x65;
        uStack_128 = 0x203a6e6f6967;
        local_1c0 = lVar17;
        strcpy((char *)((long)&uStack_128 + 6),pgVar11->name + lVar15);
        sVar6 = strlen((char *)local_138);
        sprintf((char *)((long)local_138 + (long)(int)sVar6)," [%ld:%ld ",*pIVar14,*hi);
        sVar6 = strlen((char *)local_138);
        lVar15 = local_1f8;
        iVar4 = (int)sVar6;
        if (1 < *(short *)((long)GA->dims + local_1f8 + -0x30)) {
          lVar17 = 1;
          do {
            sprintf((char *)((long)local_138 + (long)(int)sVar6),",%ld:%ld ",local_1e8[lVar17],
                    hi[lVar17]);
            sVar6 = strlen((char *)local_138);
            iVar4 = (int)sVar6;
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(short *)((long)GA->dims + lVar15 + -0x30));
        }
        *(undefined2 *)((long)local_138 + (long)iVar4) = 0x5d;
        pnga_error((char *)local_138,local_1e0);
        lVar17 = local_1c0;
        pgVar11 = GA;
        pIVar14 = local_1e8;
      }
      lVar17 = lVar17 + 1;
      uVar10 = *(ushort *)((long)pgVar11->dims + lVar15 + -0x30);
      lVar16 = (long)(short)uVar10;
    } while (lVar17 < lVar16);
    pgVar9 = (global_array_t *)((long)pgVar11->dims + lVar15 + -0x30);
  }
  plVar18 = local_1d8;
  if (-1 < (int)local_1d0) {
    local_200 = (long)PGRP_LIST[local_1d0].map_proc_list[local_200];
  }
  lVar17 = pgVar9->num_rstrctd;
  if (0 < lVar17) {
    local_200 = pgVar9->rank_rstrctd[local_200];
  }
  iVar4 = pgVar9->distr_type;
  if (iVar4 - 1U < 3) {
    lVar15 = (long)(int)local_200 % pgVar9->num_blocks[0];
    local_138[0] = (int)lVar15;
    if (1 < (short)uVar10) {
      lVar17 = *(long *)((long)pgVar11->num_blocks + local_1f8);
      lVar13 = 0;
      lVar7 = local_200;
      do {
        lVar7 = (long)((int)lVar7 - (int)lVar15) / lVar17;
        lVar17 = *(long *)((long)pgVar11[1000].num_blocks + lVar13 * 8 + local_1f0 + 8);
        lVar15 = (long)(int)lVar7 % lVar17;
        local_138[lVar13 + 1] = (int)lVar15;
        lVar13 = lVar13 + 1;
      } while ((ulong)(uint)(int)(short)uVar10 - 1 != lVar13);
    }
    lVar15 = local_1f8;
    if (0 < (short)uVar10) {
      lVar17 = 0;
      do {
        iVar4 = *(int *)((long)local_138 + lVar17);
        lVar15 = *(long *)((long)pgVar11[1000].block_dims + lVar17 * 2 + local_1f0);
        *(long *)((long)alStack_180 + lVar17 * 2 + 8U) = lVar15 * iVar4 + 1;
        lVar15 = ((long)iVar4 + 1) * lVar15;
        *(long *)((long)local_1b8 + lVar17 * 2) = lVar15;
        lVar7 = *(long *)((long)pgVar11[1000].dims + lVar17 * 2 + local_1f0);
        if (lVar7 <= lVar15) {
          lVar15 = lVar7;
        }
        *(long *)((long)local_1b8 + lVar17 * 2) = lVar15;
        lVar17 = lVar17 + 4;
        lVar15 = local_1f8;
      } while ((ulong)(uint)(int)(short)uVar10 << 2 != lVar17);
    }
  }
  else if (iVar4 == 4) {
    lVar15 = (long)(int)local_200 % pgVar9->num_blocks[0];
    local_138[0] = (int)lVar15;
    if (1 < (short)uVar10) {
      lVar17 = *(long *)((long)pgVar11->num_blocks + local_1f8);
      lVar13 = 0;
      lVar7 = local_200;
      do {
        lVar7 = (long)((int)lVar7 - (int)lVar15) / lVar17;
        lVar17 = *(long *)((long)pgVar11[1000].num_blocks + lVar13 * 8 + local_1f0 + 8);
        lVar15 = (long)(int)lVar7 % lVar17;
        local_138[lVar13 + 1] = (int)lVar15;
        lVar13 = lVar13 + 1;
      } while ((ulong)(uint)(int)(short)uVar10 - 1 != lVar13);
    }
    lVar15 = local_1f8;
    if (0 < (short)uVar10) {
      lVar17 = *(long *)(pgVar11->name + local_1f8 + -8);
      lVar7 = 0;
      iVar4 = 0;
      do {
        iVar2 = *(int *)((long)local_138 + lVar7);
        lVar15 = (long)iVar4 + (long)iVar2;
        *(undefined8 *)((long)alStack_180 + lVar7 * 2 + 8U) = *(undefined8 *)(lVar17 + lVar15 * 8);
        if ((long)iVar2 < *(long *)((long)pgVar9->num_blocks + lVar7 * 2) + -1) {
          lVar15 = pgVar9->mapc[lVar15 + 1] + -1;
        }
        else {
          lVar15 = *(long *)((long)pgVar9->dims + lVar7 * 2);
        }
        *(long *)((long)local_1b8 + lVar7 * 2) = lVar15;
        iVar4 = iVar4 + *(int *)((long)pgVar11[1000].num_blocks + lVar7 * 2 + local_1f0);
        lVar7 = lVar7 + 4;
        lVar15 = local_1f8;
      } while ((ulong)(uint)(int)(short)uVar10 << 2 != lVar7);
    }
  }
  else if (iVar4 == 0) {
    if (lVar17 == 0) {
      if (0 < lVar16) {
        lVar17 = 1;
        lVar7 = 0;
        do {
          lVar17 = lVar17 * *(int *)((long)pgVar11[1000].nblock + lVar7 * 4 + local_1f0);
          lVar7 = lVar7 + 1;
        } while (lVar16 != lVar7);
        if (local_200 < 0 || lVar17 <= local_200) {
LAB_0016cec3:
          if (0 < lVar16) {
            sVar6 = lVar16 * 8;
            goto LAB_0016ceeb;
          }
        }
        else if (0 < lVar16) {
          pCVar1 = pgVar9->mapc;
          lVar7 = 0;
          lVar13 = 0;
          lVar17 = local_200;
          do {
            lVar12 = (long)pgVar9->nblock[lVar7];
            lVar15 = lVar17 % lVar12;
            alStack_180[lVar7 + 1] = pCVar1[lVar15 + lVar13];
            if (lVar15 == lVar12 + -1) {
              CVar8 = pgVar9->dims[lVar7];
            }
            else {
              CVar8 = pCVar1[lVar15 + lVar13 + 1] + -1;
            }
            lVar13 = lVar13 + lVar12;
            local_1b8[lVar7] = CVar8;
            lVar7 = lVar7 + 1;
            lVar17 = lVar17 / lVar12;
            lVar15 = local_1f8;
          } while (lVar16 != lVar7);
        }
      }
    }
    else if (local_200 < lVar17) {
      if (0 < lVar16) {
        lVar17 = 1;
        lVar7 = 0;
        do {
          lVar17 = lVar17 * *(int *)((long)pgVar11[1000].nblock + lVar7 * 4 + local_1f0);
          lVar7 = lVar7 + 1;
        } while (lVar16 != lVar7);
        if ((local_200 < 0) || (lVar17 <= local_200)) goto LAB_0016cec3;
        if (0 < lVar16) {
          pCVar1 = pgVar9->mapc;
          lVar7 = 0;
          lVar13 = 0;
          lVar17 = local_200;
          do {
            lVar12 = (long)pgVar9->nblock[lVar13];
            lVar15 = lVar17 % lVar12;
            alStack_180[lVar13 + 1] = pCVar1[lVar15 + lVar7];
            if (lVar15 == lVar12 + -1) {
              CVar8 = pgVar9->dims[lVar13];
            }
            else {
              CVar8 = pCVar1[lVar15 + lVar7 + 1] + -1;
            }
            lVar7 = lVar7 + lVar12;
            local_1b8[lVar13] = CVar8;
            lVar13 = lVar13 + 1;
            lVar17 = lVar17 / lVar12;
            lVar15 = local_1f8;
          } while (lVar16 != lVar13);
        }
      }
    }
    else if (0 < (short)uVar10) {
      sVar6 = (ulong)uVar10 << 3;
LAB_0016ceeb:
      memset(alStack_180 + 1,0,sVar6);
      memset(local_1b8,0xff,sVar6);
      lVar15 = local_1f8;
    }
  }
  local_1e8 = (Integer *)lVar16;
  if (*(short *)((long)pgVar11->dims + lVar15 + -0x30) < 1) {
    lVar15 = (long)pgVar11->dims + lVar15 + -0x30;
  }
  else {
    lVar17 = 0;
    do {
      if (local_1b8[lVar17] < pIVar14[lVar17] || pIVar14[lVar17] < alStack_180[lVar17 + 1]) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
        pnga_error((char *)local_138,lVar17);
        pgVar11 = GA;
        lVar15 = local_1f8;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < *(short *)((long)pgVar11->dims + lVar15 + -0x30));
    lVar15 = (long)pgVar11->dims + lVar15 + -0x30;
    plVar18 = local_1d8;
  }
  if (lVar16 == 1) {
    *plVar18 = (local_1b8[0] - alStack_180[1]) + *(long *)(lVar15 + 0xc0) * 2 + 1;
  }
  else if (1 < (long)local_1e8) {
    lVar17 = 1;
    lVar7 = 0;
    lVar13 = 0;
    do {
      lVar12 = *(long *)((long)pgVar11[1000].width + lVar13 * 8 + local_1f0);
      lVar7 = lVar7 + ((lVar12 + pIVar14[lVar13]) - alStack_180[lVar13 + 1]) * lVar17;
      lVar12 = ((lVar12 * 2 + 1) - alStack_180[lVar13 + 1]) + local_1b8[lVar13];
      plVar18[lVar13] = lVar12;
      lVar17 = lVar17 * lVar12;
      lVar13 = lVar13 + 1;
    } while (lVar16 + -1 != lVar13);
    goto LAB_0016cded;
  }
  lVar17 = 1;
  lVar7 = 0;
LAB_0016cded:
  if (*(int *)(lVar15 + 0x210) == 0) {
    local_200 = (long)PGRP_LIST->inv_map_proc_list[local_200];
  }
  else if (*(long *)(lVar15 + 0x2a8) != 0) {
    local_200 = *(long *)(*(long *)(lVar15 + 0x2a0) + local_200 * 8);
  }
  *local_1c8 = (long)*(int *)(lVar15 + 0x18) *
               (((pIVar14[(long)local_1e8 + -1] - alStack_180[(long)local_1e8]) +
                *(long *)(lVar15 + 0xb8 + (long)local_1e8 * 8)) * lVar17 + lVar7) +
               *(long *)(*(long *)(lVar15 + 0x1e0) + local_200 * 8);
  return;
}

Assistant:

void pnga_access_ptr(Integer g_a, Integer lo[], Integer hi[],
                      void* ptr, Integer ld[])
{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;

   
   p_handle = GA[handle].p_handle;
   if (!pnga_locate(g_a,lo,&ow)) pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if (!pnga_locate(g_a,hi, &ow)) pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme))
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   if (p_handle >= 0) {
     ow = PGRP_LIST[p_handle].map_proc_list[ow];
   }
   if (GA[handle].num_rstrctd > 0) {
     ow = GA[handle].rank_rstrctd[ow];
   }
   gam_Location(ow,handle, lo, &lptr, ld);
   *(char**)ptr = lptr; 
}